

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

StringObject * parse_user_defined_type_name(LexerState *ls,StringObject *type_name)

{
  ulong uVar1;
  char *pcVar2;
  CompilerState *compiler_state;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  char buffer [256];
  
  iVar3 = testnext(ls,0x2e);
  if (iVar3 != 0) {
    buffer[0xc0] = '\0';
    buffer[0xc1] = '\0';
    buffer[0xc2] = '\0';
    buffer[0xc3] = '\0';
    buffer[0xc4] = '\0';
    buffer[0xc5] = '\0';
    buffer[0xc6] = '\0';
    buffer[199] = '\0';
    buffer[200] = '\0';
    buffer[0xc9] = '\0';
    buffer[0xca] = '\0';
    buffer[0xcb] = '\0';
    buffer[0xcc] = '\0';
    buffer[0xcd] = '\0';
    buffer[0xce] = '\0';
    buffer[0xcf] = '\0';
    buffer[0xd0] = '\0';
    buffer[0xd1] = '\0';
    buffer[0xd2] = '\0';
    buffer[0xd3] = '\0';
    buffer[0xd4] = '\0';
    buffer[0xd5] = '\0';
    buffer[0xd6] = '\0';
    buffer[0xd7] = '\0';
    buffer[0xd8] = '\0';
    buffer[0xd9] = '\0';
    buffer[0xda] = '\0';
    buffer[0xdb] = '\0';
    buffer[0xdc] = '\0';
    buffer[0xdd] = '\0';
    buffer[0xde] = '\0';
    buffer[0xdf] = '\0';
    buffer[0xe0] = '\0';
    buffer[0xe1] = '\0';
    buffer[0xe2] = '\0';
    buffer[0xe3] = '\0';
    buffer[0xe4] = '\0';
    buffer[0xe5] = '\0';
    buffer[0xe6] = '\0';
    buffer[0xe7] = '\0';
    buffer[0xe8] = '\0';
    buffer[0xe9] = '\0';
    buffer[0xea] = '\0';
    buffer[0xeb] = '\0';
    buffer[0xec] = '\0';
    buffer[0xed] = '\0';
    buffer[0xee] = '\0';
    buffer[0xef] = '\0';
    buffer[0xf0] = '\0';
    buffer[0xf1] = '\0';
    buffer[0xf2] = '\0';
    buffer[0xf3] = '\0';
    buffer[0xf4] = '\0';
    buffer[0xf5] = '\0';
    buffer[0xf6] = '\0';
    buffer[0xf7] = '\0';
    buffer[0xf8] = '\0';
    buffer[0xf9] = '\0';
    buffer[0xfa] = '\0';
    buffer[0xfb] = '\0';
    buffer[0xfc] = '\0';
    buffer[0xfd] = '\0';
    buffer[0xfe] = '\0';
    buffer[0xff] = '\0';
    buffer[0x80] = '\0';
    buffer[0x81] = '\0';
    buffer[0x82] = '\0';
    buffer[0x83] = '\0';
    buffer[0x84] = '\0';
    buffer[0x85] = '\0';
    buffer[0x86] = '\0';
    buffer[0x87] = '\0';
    buffer[0x88] = '\0';
    buffer[0x89] = '\0';
    buffer[0x8a] = '\0';
    buffer[0x8b] = '\0';
    buffer[0x8c] = '\0';
    buffer[0x8d] = '\0';
    buffer[0x8e] = '\0';
    buffer[0x8f] = '\0';
    buffer[0x90] = '\0';
    buffer[0x91] = '\0';
    buffer[0x92] = '\0';
    buffer[0x93] = '\0';
    buffer[0x94] = '\0';
    buffer[0x95] = '\0';
    buffer[0x96] = '\0';
    buffer[0x97] = '\0';
    buffer[0x98] = '\0';
    buffer[0x99] = '\0';
    buffer[0x9a] = '\0';
    buffer[0x9b] = '\0';
    buffer[0x9c] = '\0';
    buffer[0x9d] = '\0';
    buffer[0x9e] = '\0';
    buffer[0x9f] = '\0';
    buffer[0xa0] = '\0';
    buffer[0xa1] = '\0';
    buffer[0xa2] = '\0';
    buffer[0xa3] = '\0';
    buffer[0xa4] = '\0';
    buffer[0xa5] = '\0';
    buffer[0xa6] = '\0';
    buffer[0xa7] = '\0';
    buffer[0xa8] = '\0';
    buffer[0xa9] = '\0';
    buffer[0xaa] = '\0';
    buffer[0xab] = '\0';
    buffer[0xac] = '\0';
    buffer[0xad] = '\0';
    buffer[0xae] = '\0';
    buffer[0xaf] = '\0';
    buffer[0xb0] = '\0';
    buffer[0xb1] = '\0';
    buffer[0xb2] = '\0';
    buffer[0xb3] = '\0';
    buffer[0xb4] = '\0';
    buffer[0xb5] = '\0';
    buffer[0xb6] = '\0';
    buffer[0xb7] = '\0';
    buffer[0xb8] = '\0';
    buffer[0xb9] = '\0';
    buffer[0xba] = '\0';
    buffer[0xbb] = '\0';
    buffer[0xbc] = '\0';
    buffer[0xbd] = '\0';
    buffer[0xbe] = '\0';
    buffer[0xbf] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    pcVar2 = type_name->str;
    sVar4 = strlen(pcVar2);
    if (sVar4 < 0x100) {
      snprintf(buffer,0x100,"%s",pcVar2);
      do {
        type_name = check_name_and_next(ls);
        pcVar2 = type_name->str;
        sVar5 = strlen(pcVar2);
        uVar1 = sVar4 + 1 + sVar5;
        if (0xff < uVar1) goto LAB_0010fd9a;
        snprintf(buffer + sVar4,0x100 - sVar4,".%s",pcVar2);
        iVar3 = testnext(ls,0x2e);
        sVar4 = uVar1;
      } while (iVar3 != 0);
      compiler_state = ls->compiler_state;
      sVar4 = strlen(buffer);
      type_name = raviX_create_string(compiler_state,buffer,(uint32_t)sVar4);
    }
    else {
LAB_0010fd9a:
      raviX_syntaxerror(ls,"User defined type name is too long");
    }
  }
  return type_name;
}

Assistant:

static const StringObject *parse_user_defined_type_name(LexerState *ls,
								const StringObject *type_name)
{
	size_t len = 0;
	if (testnext(ls, '.')) {
		char buffer[256] = {0};
		const char *str = type_name->str;
		len = strlen(str);
		if (len >= sizeof buffer) {
			raviX_syntaxerror(ls, "User defined type name is too long");
			return type_name;
		}
		snprintf(buffer, sizeof buffer, "%s", str);
		do {
			type_name = check_name_and_next(ls);
			str = type_name->str;
			size_t newlen = len + strlen(str) + 1;
			if (newlen >= sizeof buffer) {
				raviX_syntaxerror(ls, "User defined type name is too long");
				return type_name;
			}
			snprintf(buffer + len, sizeof buffer - len, ".%s", str);
			len = newlen;
		} while (testnext(ls, '.'));
		type_name = raviX_create_string(ls->compiler_state, buffer, (uint32_t)strlen(buffer));
	}
	return type_name;
}